

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void update_index(storage_t *st,bool checkpointing)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  idx_prams_t *start_key;
  btree *pbVar7;
  person_t *p_00;
  fdb_status fVar8;
  int iVar9;
  checkpoint_t *pcVar10;
  undefined7 in_register_00000031;
  fdb_kvs_handle *handle;
  fdb_doc *rdoc;
  person_t *p;
  fdb_iterator *it;
  size_t vallen;
  timeval __test_begin;
  char rbuf [256];
  timeval tStack_300;
  fdb_kvs_info fStack_2f0;
  char acStack_2c0 [264];
  storage_t *psStack_1b8;
  uint local_174;
  fdb_doc *local_170;
  person_t *local_168;
  fdb_iterator *local_160;
  int local_154;
  size_t local_150;
  timeval local_148;
  char local_138 [264];
  
  gettimeofday(&local_148,(__timezone_ptr_t)0x0);
  local_168 = (person_t *)0x0;
  local_170 = (fdb_doc *)0x0;
  start_key = st->index_params;
  reset_storage_index(st);
  local_154 = (int)CONCAT71(in_register_00000031,checkpointing);
  if (local_154 != 0) {
    start_checkpoint(st);
  }
  handle = st->index1;
  fVar8 = fdb_iterator_init(handle,&local_160,start_key,0xc,start_key->max,0xc,2);
  if ((fVar8 != FDB_RESULT_ITERATOR_FAIL) && (fVar8 != FDB_RESULT_SUCCESS)) {
    update_index();
    psStack_1b8 = st;
    gettimeofday(&tStack_300,(__timezone_ptr_t)0x0);
    pcVar10 = create_checkpoint((storage_t *)handle,6);
    pbVar7 = handle->staletree;
    uVar1 = *(uint *)&pbVar7[0x12].blk_handle;
    uVar2 = *(uint *)((long)&pbVar7[0x12].blk_handle + 4);
    uVar3 = pcVar10->ndocs;
    uVar4 = pcVar10->num_indexed;
    uVar5 = pcVar10->sum_age_indexed;
    uVar6 = *(uint *)&pbVar7[0x12].blk_ops;
    e2e_fdb_commit(*(fdb_file_handle **)&handle->kvs_config,*(bool *)((long)&handle->file + 6));
    fdb_get_kvs_info((fdb_kvs_handle *)(handle->kvs_config).custom_cmp_param,&fStack_2f0);
    free(pcVar10);
    sprintf(acStack_2c0,"[%s] verifydb: ndocs(%d=%d), nidx(%d=%d), sumage(%d=%d)\n",&handle->file,
            (ulong)uVar3,(ulong)uVar1,(ulong)uVar4,(ulong)uVar2,(ulong)uVar5,(ulong)uVar6);
    return;
  }
  local_174 = 0;
  do {
    fVar8 = fdb_iterator_get(local_160,&local_170);
    if (fVar8 == FDB_RESULT_SUCCESS) {
      fVar8 = fdb_get_kv(st->all_docs,local_170->body,local_170->bodylen,&local_168,&local_150);
      p_00 = local_168;
      if (fVar8 == FDB_RESULT_SUCCESS) {
        iVar9 = strcmp(local_168->keyspace,st->keyspace);
        if (iVar9 == 0) {
          e2e_fdb_del_person(st,p_00);
          local_174 = local_174 + 1;
        }
        free(local_168);
        local_168 = (person_t *)0x0;
      }
      fdb_doc_free(local_170);
      local_170 = (fdb_doc *)0x0;
    }
    fVar8 = fdb_iterator_next(local_160);
  } while (fVar8 != FDB_RESULT_ITERATOR_FAIL);
  if ((char)local_154 != '\0') {
    end_checkpoint(st);
  }
  fdb_iterator_close(local_160);
  pcVar10 = st->v_chk;
  pcVar10->num_indexed = 0;
  pcVar10->sum_age_indexed = 0;
  sprintf(local_138,"update index: %03d docs deleted",(ulong)local_174);
  return;
}

Assistant:

void update_index(storage_t *st, bool checkpointing) {

    TEST_INIT();

    fdb_iterator *it;
    person_t *p = NULL;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    int n = 0;
    size_t vallen;
    char *mink = st->index_params->min;
    char *maxk = st->index_params->max;
    char rbuf[256];

    // change storage index range
    reset_storage_index(st);

    if (checkpointing) {
        start_checkpoint(st);
    }
    status = fdb_iterator_init(st->index1, &it, mink, 12,
                               maxk, 12, FDB_ITR_NO_DELETES);
    if (status != FDB_RESULT_SUCCESS) {
        // no items within min max range
        TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    }



    do {
        status = fdb_iterator_get(it, &rdoc);
        if (status == FDB_RESULT_SUCCESS) {
            status = fdb_get_kv(st->all_docs,
                                rdoc->body, rdoc->bodylen,
                                (void **)&p, &vallen);
            if (status == FDB_RESULT_SUCCESS) {
                if (strcmp(p->keyspace, st->keyspace) == 0) {
                    e2e_fdb_del_person(st, p);
                    n++;
                }
                free(p);
                p=NULL;
            }
            fdb_doc_free(rdoc);
            rdoc=NULL;
        }
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    if (checkpointing) {
        end_checkpoint(st);
    }

    fdb_iterator_close(it);

    // reset verification chkpoint
    st->v_chk->num_indexed = 0;
    st->v_chk->sum_age_indexed = 0;

    sprintf(rbuf, "update index: %03d docs deleted", n);
#ifdef __DEBUG_E2E
    TEST_RESULT(rbuf);
#endif
}